

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetTraceDependencies::cmTargetTraceDependencies
          (cmTargetTraceDependencies *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  cmLocalGenerator *pcVar4;
  cmGlobalGenerator *pcVar5;
  reference config;
  reference ppcVar6;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar7;
  ostream *poVar8;
  string *psVar9;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar10;
  pair<std::_Rb_tree_const_iterator<cmSourceFile_*>,_bool> pVar11;
  byte local_3c2;
  string local_2e0;
  undefined1 local_2c0 [8];
  ostringstream e;
  _Self local_148;
  _Self local_140;
  undefined1 local_138 [8];
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  tgts;
  cmSourceFile *sf;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_f8;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_f0;
  const_iterator si;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  const_iterator ci;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  value_type local_80;
  string local_60;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorTarget *target_local;
  cmTargetTraceDependencies *this_local;
  
  this->GeneratorTarget = target;
  std::queue<cmSourceFile*,std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>>::
  queue<std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>,void>
            ((queue<cmSourceFile*,std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>> *)
             &this->SourceQueue);
  std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::set
            (&this->SourcesQueued);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  ::map(&this->NameMap);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->NewSources);
  pcVar3 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar3;
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar4;
  pcVar5 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
  this->GlobalGenerator = pcVar5;
  this->CurrentEntry = (SourceEntry *)0x0;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != INTERFACE_LIBRARY) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    cmMakefile::GetConfigurations
              (&local_60,this->Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40,true);
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,"",
                 (allocator *)((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    }
    std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::set
              ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
               &ci);
    local_c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_c0,&local_c8);
    while( true ) {
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40);
      bVar1 = __gnu_cxx::operator!=
                        (&local_c0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&sources.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&si);
      this_00 = this->GeneratorTarget;
      config = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c0);
      cmGeneratorTarget::GetSourceFiles
                (this_00,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&si,config);
      local_f8._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&si);
      __gnu_cxx::
      __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
      ::__normal_iterator<cmSourceFile**>
                ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                  *)&local_f0,&local_f8);
      while( true ) {
        sf = (cmSourceFile *)
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&si);
        bVar1 = __gnu_cxx::operator!=
                          (&local_f0,
                           (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                            *)&sf);
        if (!bVar1) break;
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&local_f0);
        tgts._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppcVar6;
        psVar7 = cmGlobalGenerator::GetFilenameTargetDepends
                           (this->GlobalGenerator,
                            (cmSourceFile *)tgts._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
               *)local_138,psVar7);
        local_140._M_node =
             (_Base_ptr)
             std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::find((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)local_138,&this->GeneratorTarget);
        local_148._M_node =
             (_Base_ptr)
             std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::end((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    *)local_138);
        bVar1 = std::operator!=(&local_140,&local_148);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c0);
          poVar8 = std::operator<<((ostream *)local_2c0,"Evaluation output file\n  \"");
          psVar9 = cmSourceFile::GetFullPath
                             ((cmSourceFile *)tgts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (string *)0x0);
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          std::operator<<(poVar8,
                          "\"\ndepends on the sources of a target it is used in.  This is a dependency loop and is not allowed."
                         );
          pcVar4 = this->GeneratorTarget->LocalGenerator;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar4,FATAL_ERROR,&local_2e0);
          std::__cxx11::string::~string((string *)&local_2e0);
          bVar1 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c0);
        }
        else {
          pVar11 = std::
                   set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::
                   insert((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
                           *)&ci,(value_type *)
                                 &tgts._M_t._M_impl.super__Rb_tree_header._M_node_count);
          local_3c2 = 0;
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pVar11 = std::
                     set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
                     ::insert(&this->SourcesQueued,
                              (value_type *)&tgts._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_3c2 = pVar11.second;
          }
          if ((local_3c2 & 1) != 0) {
            std::queue<cmSourceFile_*,_std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::push(&this->SourceQueue,
                   (value_type *)&tgts._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          bVar1 = false;
        }
        std::
        set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *)local_138);
        if (bVar1) goto LAB_006a2cde;
        __gnu_cxx::
        __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&local_f0);
      }
      bVar1 = false;
LAB_006a2cde:
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&si);
      if (bVar1) goto LAB_006a2d2d;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c0);
    }
    bVar1 = false;
LAB_006a2d2d:
    std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::~set
              ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
               &ci);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    if (bVar1) {
      return;
    }
  }
  pvVar10 = cmGeneratorTarget::GetPreBuildCommands(this->GeneratorTarget);
  CheckCustomCommands(this,pvVar10);
  pvVar10 = cmGeneratorTarget::GetPreLinkCommands(this->GeneratorTarget);
  CheckCustomCommands(this,pvVar10);
  pvVar10 = cmGeneratorTarget::GetPostBuildCommands(this->GeneratorTarget);
  CheckCustomCommands(this,pvVar10);
  return;
}

Assistant:

cmTargetTraceDependencies::cmTargetTraceDependencies(cmGeneratorTarget* target)
  : GeneratorTarget(target)
{
  // Convenience.
  this->Makefile = target->Target->GetMakefile();
  this->LocalGenerator = target->GetLocalGenerator();
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();
  this->CurrentEntry = CM_NULLPTR;

  // Queue all the source files already specified for the target.
  if (target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    std::vector<std::string> configs;
    this->Makefile->GetConfigurations(configs);
    if (configs.empty()) {
      configs.push_back("");
    }
    std::set<cmSourceFile*> emitted;
    for (std::vector<std::string>::const_iterator ci = configs.begin();
         ci != configs.end(); ++ci) {
      std::vector<cmSourceFile*> sources;
      this->GeneratorTarget->GetSourceFiles(sources, *ci);
      for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
           si != sources.end(); ++si) {
        cmSourceFile* sf = *si;
        const std::set<cmGeneratorTarget const*> tgts =
          this->GlobalGenerator->GetFilenameTargetDepends(sf);
        if (tgts.find(this->GeneratorTarget) != tgts.end()) {
          std::ostringstream e;
          e << "Evaluation output file\n  \"" << sf->GetFullPath()
            << "\"\ndepends on the sources of a target it is used in.  This "
               "is a dependency loop and is not allowed.";
          this->GeneratorTarget->LocalGenerator->IssueMessage(
            cmake::FATAL_ERROR, e.str());
          return;
        }
        if (emitted.insert(sf).second &&
            this->SourcesQueued.insert(sf).second) {
          this->SourceQueue.push(sf);
        }
      }
    }
  }

  // Queue pre-build, pre-link, and post-build rule dependencies.
  this->CheckCustomCommands(this->GeneratorTarget->GetPreBuildCommands());
  this->CheckCustomCommands(this->GeneratorTarget->GetPreLinkCommands());
  this->CheckCustomCommands(this->GeneratorTarget->GetPostBuildCommands());
}